

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

line_t_conflict * FindDestination(line_t_conflict *src,int tag)

{
  FLineIdIterator local_28;
  FLineIdIterator it;
  int lineno;
  int tag_local;
  line_t_conflict *src_local;
  
  if (tag == 0) {
LAB_006311c9:
    src_local = (line_t_conflict *)0x0;
  }
  else {
    it.searchtag = -1;
    it.start = tag;
    FLineIdIterator::FLineIdIterator(&local_28,tag);
    do {
      it.searchtag = FLineIdIterator::Next(&local_28);
      if (it.searchtag < 0) goto LAB_006311c9;
    } while (lines + it.searchtag == src);
    src_local = lines + it.searchtag;
  }
  return src_local;
}

Assistant:

static line_t *FindDestination(line_t *src, int tag)
{
	if (tag)
	{
		int lineno = -1;
		FLineIdIterator it(tag);

		while ((lineno = it.Next()) >= 0)
		{
			if (&lines[lineno] != src)
			{
				return &lines[lineno];
			}
		}
	}
	return NULL;
}